

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

int hd_peek_byte(hd_context *ctx,hd_stream *stm)

{
  uint uVar1;
  
  if (stm->rp == stm->wp) {
    uVar1 = (*stm->next)(ctx,stm,1);
    if (uVar1 == 0xffffffff) {
      uVar1 = 0xffffffff;
    }
    else {
      stm->rp = stm->rp + -1;
    }
  }
  else {
    uVar1 = (uint)*stm->rp;
  }
  return uVar1;
}

Assistant:

static inline int hd_peek_byte(hd_context *ctx, hd_stream *stm)
{
    int c;

    if (stm->rp != stm->wp)
        return *stm->rp;

    c = stm->next(ctx, stm, 1);
    if (c != EOF)
        stm->rp--;
    return c;
}